

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_clone_alloc(wally_tx *tx,uint32_t flags,wally_tx **output)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  wally_tx *result;
  
  result = (wally_tx *)0x0;
  iVar2 = -2;
  if (output != (wally_tx **)0x0) {
    *output = (wally_tx *)0x0;
    _Var1 = is_valid_tx(tx);
    if (flags == 0 && _Var1) {
      iVar2 = wally_tx_init_alloc(tx->version,tx->locktime,tx->num_inputs,tx->num_outputs,&result);
      lVar4 = 0;
      for (uVar3 = 0; (iVar2 == 0 && (uVar3 < tx->num_inputs)); uVar3 = uVar3 + 1) {
        iVar2 = wally_tx_add_input(result,(wally_tx_input *)(tx->inputs->txhash + lVar4));
        lVar4 = lVar4 + 0xd0;
      }
      lVar4 = 0;
      uVar3 = 0;
      while (iVar2 == 0) {
        if (tx->num_outputs <= uVar3) {
          *output = result;
          return 0;
        }
        iVar2 = wally_tx_add_output(result,(wally_tx_output *)((long)&tx->outputs->satoshi + lVar4))
        ;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x70;
      }
      wally_tx_free(result);
    }
  }
  return iVar2;
}

Assistant:

int wally_tx_clone_alloc(const struct wally_tx *tx, uint32_t flags, struct wally_tx **output)
{
    size_t i;
    struct wally_tx *result = NULL;
    int ret;

    TX_CHECK_OUTPUT;

    if (!is_valid_tx(tx) || flags != 0)
        return WALLY_EINVAL;

    ret = wally_tx_init_alloc(tx->version, tx->locktime, tx->num_inputs, tx->num_outputs, &result);

    for (i = 0; ret == WALLY_OK && i < tx->num_inputs; ++i)
        ret = wally_tx_add_input(result, &tx->inputs[i]);

    for (i = 0; ret == WALLY_OK && i < tx->num_outputs; ++i)
        ret = wally_tx_add_output(result, &tx->outputs[i]);

    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_free(result);

    return ret;
}